

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode gzip_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  
  if (((byte)type & nbytes != 0) == 0) {
    CVar1 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar1;
  }
  if (*(int *)&writer[1].cwt != 0) {
    if (*(int *)&writer[1].cwt == 4) {
      writer[0x201].next = (Curl_cwriter *)buf;
      *(int *)&writer[0x201].ctx = (int)nbytes;
      CVar1 = inflate_stream(data,writer,type,ZLIB_INIT_GZIP);
      return CVar1;
    }
    inflateEnd(&writer[0x201].next);
    *(undefined4 *)&writer[1].cwt = 0;
  }
  return CURLE_WRITE_ERROR;
}

Assistant:

static CURLcode gzip_do_write(struct Curl_easy *data,
                              struct Curl_cwriter *writer, int type,
                              const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  if(zp->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (z_const Bytef *)buf;
    z->avail_in = (uInt)nbytes;
    /* Now uncompress the data */
    return inflate_stream(data, writer, type, ZLIB_INIT_GZIP);
  }

  /* We are running with an old version: return error. */
  return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);
}